

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Checker.h
# Opt level: O0

void soul::heart::Checker::checkBlockParameters(Program *program)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_> *this;
  Module *pMVar4;
  Function *pFVar5;
  reference pvVar6;
  Block *pBVar7;
  Function *pFVar8;
  reference this_00;
  reference this_01;
  undefined4 extraout_var;
  Branch *pBVar9;
  size_type sVar10;
  size_t sVar11;
  Type *pTVar12;
  pool_ref<soul::heart::Expression> *this_02;
  Expression *pEVar13;
  undefined4 extraout_var_00;
  reference this_03;
  Variable *pVVar14;
  undefined4 extraout_var_01;
  BranchIf *pBVar15;
  Identifier *args;
  Identifier *args_00;
  Identifier *args_01;
  Identifier *args_02;
  char (*args_03) [30];
  CompileMessage local_208;
  pool_ptr<soul::heart::Terminator> local_1d0;
  pool_ptr<soul::heart::BranchIf> local_1c8;
  pool_ptr<soul::heart::BranchIf> branchIf;
  Type *parameterType;
  Type *argType;
  size_t n;
  pool_ptr<soul::heart::Terminator> local_138;
  pool_ptr<soul::heart::Branch> local_130;
  pool_ptr<soul::heart::Branch> branch;
  Type *type;
  pool_ref<soul::heart::Variable> *param;
  iterator __end6;
  iterator __begin6;
  vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
  *__range6;
  pool_ref<soul::heart::Block> *b;
  iterator __end5;
  iterator __begin5;
  vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
  *__range5;
  CompileMessage local_98;
  pool_ref<soul::heart::Function> *local_60;
  pool_ref<soul::heart::Function> *f;
  pool_ref<soul::heart::Function> *__end3;
  pool_ref<soul::heart::Function> *__begin3;
  ArrayView<soul::pool_ref<soul::heart::Function>_> *local_38;
  ArrayView<soul::pool_ref<soul::heart::Function>_> *__range3;
  pool_ref<soul::Module> *m;
  const_iterator __end2;
  const_iterator __begin2;
  vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_> *__range2;
  Program *program_local;
  
  this = Program::getModules(program);
  __end2 = std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
           ::begin(this);
  m = (pool_ref<soul::Module> *)
      std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>::end
                (this);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
                                *)&m);
    if (!bVar1) {
      return;
    }
    __range3 = (ArrayView<soul::pool_ref<soul::heart::Function>_> *)
               __gnu_cxx::
               __normal_iterator<const_soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
               ::operator*(&__end2);
    pMVar4 = pool_ref<soul::Module>::operator->((pool_ref<soul::Module> *)__range3);
    ___begin3 = Module::Functions::get(&pMVar4->functions);
    local_38 = (ArrayView<soul::pool_ref<soul::heart::Function>_> *)&__begin3;
    __end3 = ArrayView<soul::pool_ref<soul::heart::Function>_>::begin(local_38);
    f = ArrayView<soul::pool_ref<soul::heart::Function>_>::end(local_38);
    for (; __end3 != f; __end3 = __end3 + 1) {
      local_60 = __end3;
      pFVar5 = pool_ref<soul::heart::Function>::operator->(__end3);
      bVar1 = std::
              vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
              ::empty(&pFVar5->blocks);
      if (!bVar1) {
        pFVar5 = pool_ref<soul::heart::Function>::operator->(local_60);
        pvVar6 = std::
                 vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
                 ::operator[](&pFVar5->blocks,0);
        pBVar7 = pool_ref<soul::heart::Block>::operator->(pvVar6);
        bVar1 = std::
                vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                ::empty(&pBVar7->parameters);
        if (!bVar1) {
          pFVar5 = pool_ref<soul::heart::Function>::operator->(local_60);
          pFVar8 = pool_ref<soul::heart::Function>::operator->(local_60);
          pvVar6 = std::
                   vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
                   ::operator[](&pFVar8->blocks,0);
          pBVar7 = pool_ref<soul::heart::Block>::operator->(pvVar6);
          Errors::functionBlockCantBeParameterised<soul::Identifier&>
                    (&local_98,(Errors *)&pBVar7->name,args);
          CodeLocation::throwError(&(pFVar5->super_Object).location,&local_98);
        }
        pFVar5 = pool_ref<soul::heart::Function>::operator->(local_60);
        __end5 = std::
                 vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
                 ::begin(&pFVar5->blocks);
        b = (pool_ref<soul::heart::Block> *)
            std::
            vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
            ::end(&pFVar5->blocks);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end5,(__normal_iterator<soul::pool_ref<soul::heart::Block>_*,_std::vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>_>
                                           *)&b), bVar1) {
          this_00 = __gnu_cxx::
                    __normal_iterator<soul::pool_ref<soul::heart::Block>_*,_std::vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>_>
                    ::operator*(&__end5);
          pBVar7 = pool_ref<soul::heart::Block>::operator->(this_00);
          __end6 = std::
                   vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                   ::begin(&pBVar7->parameters);
          param = (pool_ref<soul::heart::Variable> *)
                  std::
                  vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                  ::end(&pBVar7->parameters);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end6,(__normal_iterator<soul::pool_ref<soul::heart::Variable>_*,_std::vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>_>
                                             *)&param), bVar1) {
            this_01 = __gnu_cxx::
                      __normal_iterator<soul::pool_ref<soul::heart::Variable>_*,_std::vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>_>
                      ::operator*(&__end6);
            pVVar14 = pool_ref<soul::heart::Variable>::operator->(this_01);
            iVar2 = (*(pVVar14->super_Expression).super_Object._vptr_Object[2])();
            bVar1 = Type::isReference((Type *)CONCAT44(extraout_var,iVar2));
            if ((bVar1) || (bVar1 = Type::isVoid((Type *)CONCAT44(extraout_var,iVar2)), bVar1)) {
              pVVar14 = pool_ref<soul::heart::Variable>::operator->(this_01);
              pBVar7 = pool_ref<soul::heart::Block>::operator->(this_00);
              Errors::blockParametersInvalid<soul::Identifier&>
                        ((CompileMessage *)&branch,(Errors *)&pBVar7->name,args_00);
              CodeLocation::throwError
                        (&(pVVar14->super_Expression).super_Object.location,
                         (CompileMessage *)&branch);
            }
            __gnu_cxx::
            __normal_iterator<soul::pool_ref<soul::heart::Variable>_*,_std::vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>_>
            ::operator++(&__end6);
          }
          pBVar7 = pool_ref<soul::heart::Block>::operator->(this_00);
          local_138.object = (pBVar7->terminator).object;
          cast<soul::heart::Branch,soul::heart::Terminator>((soul *)&local_130,&local_138);
          pool_ptr<soul::heart::Terminator>::~pool_ptr(&local_138);
          bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_130);
          if (bVar1) {
            pBVar9 = pool_ptr<soul::heart::Branch>::operator->(&local_130);
            pBVar7 = pool_ref<soul::heart::Block>::operator->(&pBVar9->target);
            sVar10 = std::
                     vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                     ::size(&pBVar7->parameters);
            pBVar9 = pool_ptr<soul::heart::Branch>::operator->(&local_130);
            sVar11 = ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::size
                               (&pBVar9->targetArgs);
            if (sVar10 != sVar11) {
              pFVar5 = pool_ref<soul::heart::Function>::operator->(local_60);
              pBVar7 = pool_ref<soul::heart::Block>::operator->(this_00);
              Errors::branchInvalidParameters<soul::Identifier&>
                        ((CompileMessage *)&n,(Errors *)&pBVar7->name,args_01);
              CodeLocation::throwError(&(pFVar5->super_Object).location,(CompileMessage *)&n);
            }
            argType = (Type *)0x0;
            while( true ) {
              pBVar9 = pool_ptr<soul::heart::Branch>::operator->(&local_130);
              pTVar12 = (Type *)ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>
                                ::size(&pBVar9->targetArgs);
              if (pTVar12 <= argType) break;
              pBVar9 = pool_ptr<soul::heart::Branch>::operator->(&local_130);
              this_02 = ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::
                        operator[](&pBVar9->targetArgs,(size_t)argType);
              pEVar13 = pool_ref<soul::heart::Expression>::operator->(this_02);
              iVar2 = (*(pEVar13->super_Object)._vptr_Object[2])();
              pBVar9 = pool_ptr<soul::heart::Branch>::operator->(&local_130);
              pBVar7 = pool_ref<soul::heart::Block>::operator->(&pBVar9->target);
              this_03 = std::
                        vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
                        ::operator[](&pBVar7->parameters,(size_type)argType);
              pVVar14 = pool_ref<soul::heart::Variable>::operator->(this_03);
              iVar3 = (*(pVVar14->super_Expression).super_Object._vptr_Object[2])();
              bVar1 = TypeRules::canSilentlyCastTo
                                ((Type *)CONCAT44(extraout_var_01,iVar3),
                                 (Type *)CONCAT44(extraout_var_00,iVar2));
              if (!bVar1) {
                pFVar5 = pool_ref<soul::heart::Function>::operator->(local_60);
                pBVar7 = pool_ref<soul::heart::Block>::operator->(this_00);
                Errors::branchInvalidParameters<soul::Identifier&>
                          ((CompileMessage *)&branchIf,(Errors *)&pBVar7->name,args_02);
                CodeLocation::throwError
                          (&(pFVar5->super_Object).location,(CompileMessage *)&branchIf);
              }
              argType = (Type *)&argType->arrayElementCategory;
            }
          }
          else {
            pBVar7 = pool_ref<soul::heart::Block>::operator->(this_00);
            local_1d0.object = (pBVar7->terminator).object;
            cast<soul::heart::BranchIf,soul::heart::Terminator>((soul *)&local_1c8,&local_1d0);
            pool_ptr<soul::heart::Terminator>::~pool_ptr(&local_1d0);
            bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_1c8);
            if (bVar1) {
              pBVar15 = pool_ptr<soul::heart::BranchIf>::operator->(&local_1c8);
              bVar1 = ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::empty
                                (pBVar15->targetArgs);
              if (!bVar1) {
LAB_0047d236:
                pFVar5 = pool_ref<soul::heart::Function>::operator->(local_60);
                Errors::notYetImplemented<char_const(&)[30]>
                          (&local_208,(Errors *)"BranchIf parameterised blocks",args_03);
                CodeLocation::throwError(&(pFVar5->super_Object).location,&local_208);
              }
              pBVar15 = pool_ptr<soul::heart::BranchIf>::operator->(&local_1c8);
              bVar1 = ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::empty
                                (pBVar15->targetArgs + 1);
              if (!bVar1) goto LAB_0047d236;
            }
            pool_ptr<soul::heart::BranchIf>::~pool_ptr(&local_1c8);
          }
          pool_ptr<soul::heart::Branch>::~pool_ptr(&local_130);
          __gnu_cxx::
          __normal_iterator<soul::pool_ref<soul::heart::Block>_*,_std::vector<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>_>
          ::operator++(&__end5);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

static void checkBlockParameters (const Program& program)
    {
        for (auto& m : program.getModules())
        {
            for (auto& f : m->functions.get())
            {
                if (! f->blocks.empty())
                {
                    if (! f->blocks[0]->parameters.empty())
                        f->location.throwError (Errors::functionBlockCantBeParameterised (f->blocks[0]->name));

                    for (auto& b : f->blocks)
                    {
                        for (auto& param : b->parameters)
                        {
                            auto& type = param->getType();

                            if (type.isReference() || type.isVoid())
                                param->location.throwError (Errors::blockParametersInvalid (b->name));
                        }

                        if (auto branch = cast<heart::Branch> (b->terminator))
                        {
                            if (branch->target->parameters.size() != branch->targetArgs.size())
                                f->location.throwError (Errors::branchInvalidParameters (b->name));

                            for (size_t n = 0; n < branch->targetArgs.size(); n++)
                            {
                                auto& argType = branch->targetArgs[n]->getType();
                                auto& parameterType = branch->target->parameters[n]->getType();

                                if (! TypeRules::canSilentlyCastTo (parameterType, argType))
                                    f->location.throwError (Errors::branchInvalidParameters (b->name));
                            }
                        }
                        else if (auto branchIf = cast<heart::BranchIf> (b->terminator))
                        {
                            if (! branchIf->targetArgs[0].empty() || ! branchIf->targetArgs[1].empty())
                                f->location.throwError (Errors::notYetImplemented ("BranchIf parameterised blocks"));
                        }
                    }
                }
            }
        }
    }